

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

int run_test_condvar_4(void)

{
  uv_mutex_t *puVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  short *psVar9;
  ulong uVar10;
  undefined1 *puVar11;
  code *pcVar12;
  char *pcVar13;
  uv_connect_t *puVar14;
  uv_tcp_t *puVar15;
  bool bVar16;
  uv_thread_t thread;
  worker_config_conflict wc;
  undefined1 auStack_4d8 [16];
  undefined1 auStack_4c8 [16];
  code *pcStack_4b8;
  code *pcStack_4b0;
  code *pcStack_4a8;
  code *pcStack_4a0;
  undefined1 auStack_48c [16];
  undefined1 auStack_47c [28];
  int aiStack_460 [24];
  long alStack_400 [31];
  undefined1 auStack_308 [96];
  undefined1 auStack_2a8 [248];
  long lStack_1b0;
  ulong uStack_1a8;
  worker_config_conflict wStack_1a0;
  worker_config_conflict *pwStack_e8;
  undefined1 auStack_c8 [8];
  worker_config_conflict local_c0;
  
  worker_config_init(&local_c0,1,condvar_signal,condvar_timedwait);
  iVar3 = uv_thread_create(auStack_c8,worker,&local_c0);
  if (iVar3 == 0) {
    (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
    iVar3 = uv_thread_join(auStack_c8);
    if (iVar3 == 0) {
      worker_config_destroy(&local_c0);
      return 0;
    }
  }
  else {
    run_test_condvar_4_cold_1();
  }
  run_test_condvar_4_cold_2();
  uStack_1a8 = 0x14d4f3;
  pwStack_e8 = &local_c0;
  worker_config_init(&wStack_1a0,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_1a0.mutex;
  uStack_1a8 = 0x14d500;
  uv_mutex_lock(puVar1);
  uStack_1a8 = 0x14d505;
  lVar6 = uv_hrtime();
  uStack_1a8 = 0x14d51a;
  uVar4 = uv_cond_timedwait(&wStack_1a0.cond,puVar1,100000000);
  uStack_1a8 = 0x14d521;
  lVar7 = uv_hrtime();
  uStack_1a8 = 0x14d52c;
  uv_mutex_unlock(puVar1);
  if (uVar4 == 0xffffff92) {
    if ((ulong)(lVar7 - lVar6) < 75000000) goto LAB_0014d563;
    if ((ulong)(lVar7 - lVar6) < 0x1dcd6501) {
      uStack_1a8 = 0x14d54e;
      worker_config_destroy(&wStack_1a0);
      return 0;
    }
  }
  else {
    uStack_1a8 = 0x14d563;
    run_test_condvar_5_cold_1();
LAB_0014d563:
    uStack_1a8 = 0x14d568;
    run_test_condvar_5_cold_2();
  }
  uStack_1a8 = 0x14d56d;
  run_test_condvar_5_cold_3();
  pcStack_4a0 = (code *)0x14d57e;
  lStack_1b0 = lVar6;
  uStack_1a8 = (ulong)uVar4;
  uVar8 = uv_default_loop();
  iVar3 = (int)auStack_2a8;
  pcStack_4a0 = (code *)0x14d591;
  iVar5 = uv_tcp_init(uVar8);
  if (iVar5 == 0) {
    iVar3 = 0x23a3;
    pcStack_4a0 = (code *)0x14d5af;
    iVar5 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_48c);
    if (iVar5 != 0) goto LAB_0014d6bf;
    puVar11 = auStack_2a8;
    pcStack_4a0 = (code *)0x14d5d8;
    iVar5 = uv_tcp_connect(auStack_308,puVar11,auStack_48c,connect_4);
    iVar3 = (int)puVar11;
    if (iVar5 != 0) goto LAB_0014d6c4;
    pcStack_4a0 = (code *)0x14d5f2;
    iVar3 = uv_interface_addresses(alStack_400);
    if (iVar3 != 0) {
LAB_0014d5f6:
      iVar3 = 0;
      pcStack_4a0 = (code *)0x14d600;
      iVar5 = uv_run(uVar8);
      if (iVar5 == 0) {
        return 0;
      }
      goto LAB_0014d6c9;
    }
    if ((long)aiStack_460[0] < 1) {
LAB_0014d6b0:
      pcStack_4a0 = (code *)0x14d6b5;
      uv_free_interface_addresses();
      goto LAB_0014d5f6;
    }
    psVar9 = (short *)(alStack_400[0] + 0x14);
    uVar10 = 1;
    do {
      sVar2 = *psVar9;
      if (sVar2 == 10) break;
      psVar9 = psVar9 + 0x28;
      bVar16 = uVar10 < (ulong)(long)aiStack_460[0];
      uVar10 = uVar10 + 1;
    } while (bVar16);
    pcStack_4a0 = (code *)0x14d651;
    uv_free_interface_addresses();
    if (sVar2 != 10) goto LAB_0014d5f6;
    iVar3 = (int)alStack_400;
    pcStack_4a0 = (code *)0x14d667;
    iVar5 = uv_tcp_init(uVar8);
    if (iVar5 != 0) goto LAB_0014d6ce;
    iVar3 = 0x23a3;
    pcStack_4a0 = (code *)0x14d681;
    iVar5 = uv_ip6_addr("::",0x23a3,auStack_47c);
    if (iVar5 == 0) {
      pcStack_4a0 = (code *)0x14d6a3;
      iVar3 = uv_tcp_connect(aiStack_460,alStack_400,auStack_47c,connect_6);
      if (iVar3 != 0) {
        pcStack_4a0 = (code *)0x14d6b0;
        run_test_connect_unspecified_cold_6();
        goto LAB_0014d6b0;
      }
      goto LAB_0014d5f6;
    }
  }
  else {
    pcStack_4a0 = (code *)0x14d6bf;
    run_test_connect_unspecified_cold_1();
LAB_0014d6bf:
    pcStack_4a0 = (code *)0x14d6c4;
    run_test_connect_unspecified_cold_2();
LAB_0014d6c4:
    pcStack_4a0 = (code *)0x14d6c9;
    run_test_connect_unspecified_cold_3();
LAB_0014d6c9:
    pcStack_4a0 = (code *)0x14d6ce;
    run_test_connect_unspecified_cold_7();
LAB_0014d6ce:
    pcStack_4a0 = (code *)0x14d6d3;
    run_test_connect_unspecified_cold_4();
  }
  pcStack_4a0 = connect_4;
  run_test_connect_unspecified_cold_5();
  if (iVar3 != -99) {
    return extraout_EAX;
  }
  pcStack_4a8 = connect_6;
  connect_4_cold_1();
  if (iVar3 != -99) {
    return extraout_EAX_00;
  }
  pcStack_4b0 = run_test_connection_fail;
  connect_6_cold_1();
  pcVar12 = on_connect_with_close;
  pcStack_4b8 = (code *)0x14d6fd;
  pcStack_4b0 = (code *)uVar8;
  connection_fail(on_connect_with_close);
  if (timer_close_cb_calls == 0) {
    if (timer_cb_calls != 0) goto LAB_0014d74c;
    pcStack_4b8 = (code *)0x14d714;
    uVar8 = uv_default_loop();
    pcStack_4b8 = (code *)0x14d728;
    uv_walk(uVar8,close_walk_cb,0);
    pcStack_4b8 = (code *)0x14d732;
    uv_run(uVar8);
    pcStack_4b8 = (code *)0x14d737;
    pcVar12 = (code *)uv_default_loop();
    pcStack_4b8 = (code *)0x14d73f;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_4b8 = (code *)0x14d74c;
    run_test_connection_fail_cold_1();
LAB_0014d74c:
    pcStack_4b8 = (code *)0x14d751;
    run_test_connection_fail_cold_2();
  }
  pcStack_4b8 = connection_fail;
  run_test_connection_fail_cold_3();
  pcVar13 = "0.0.0.0";
  iVar5 = 0;
  pcStack_4b8 = (code *)uVar8;
  iVar3 = uv_ip4_addr("0.0.0.0",0,auStack_4c8);
  if (iVar3 == 0) {
    puVar14 = (uv_connect_t *)0x194b4a;
    iVar5 = 0x23a3;
    iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_4d8);
    if (iVar3 != 0) goto LAB_0014d809;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar5 = 0x2dfbc0;
    iVar3 = uv_tcp_init();
    if (iVar3 != 0) goto LAB_0014d80e;
    puVar15 = &tcp;
    puVar11 = auStack_4c8;
    iVar3 = uv_tcp_bind(&tcp,puVar11,0);
    iVar5 = (int)puVar11;
    puVar14 = (uv_connect_t *)puVar15;
    if (iVar3 != 0) goto LAB_0014d813;
    puVar14 = &req;
    iVar5 = 0x2dfbc0;
    iVar3 = uv_tcp_connect(&req,&tcp,auStack_4d8,pcVar12);
    if (iVar3 != 0) goto LAB_0014d818;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar5 = 0;
    iVar3 = uv_run();
    if (connect_cb_calls != 1) goto LAB_0014d81d;
    if (close_cb_calls == 1) {
      return iVar3;
    }
  }
  else {
    connection_fail_cold_1();
    puVar14 = (uv_connect_t *)pcVar13;
LAB_0014d809:
    connection_fail_cold_2();
LAB_0014d80e:
    connection_fail_cold_3();
LAB_0014d813:
    connection_fail_cold_4();
LAB_0014d818:
    connection_fail_cold_5();
LAB_0014d81d:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)(((uv_tcp_t *)puVar14)->u).reserved[3] == &tcp) {
    if (iVar5 != -0x6f) goto LAB_0014d862;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      iVar3 = uv_close(&tcp,on_close);
      return iVar3;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0014d862:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  uVar8 = uv_default_loop();
  iVar5 = 0x2dfb28;
  iVar3 = uv_timer_init(uVar8);
  if (iVar3 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014d8e0;
    if (timer_cb_calls == 1) {
      uVar8 = uv_default_loop();
      uv_walk(uVar8,close_walk_cb,0);
      iVar5 = 0;
      uv_run(uVar8);
      uVar8 = uv_default_loop();
      iVar3 = uv_loop_close(uVar8);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0014d8ea;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014d8e0:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014d8ea:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar5 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX_01;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(condvar_4) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_timedwait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  wc.wait_cond(&wc, &wc.posted_1);
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}